

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

const_iterator * __thiscall
Catch::TextFlow::Column::const_iterator::operator++(const_iterator *this)

{
  Column *pCVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = this->m_lineStart + this->m_lineLength;
  pCVar1 = this->m_column;
  this->m_lineStart = uVar4;
  uVar2 = (pCVar1->m_string)._M_string_length;
  if ((uVar4 < uVar2) && ((pCVar1->m_string)._M_dataplus._M_p[uVar4] == '\n')) {
    this->m_lineStart = uVar4 + 1;
  }
  else if (this->m_lineStart < uVar2) {
    pcVar3 = (pCVar1->m_string)._M_dataplus._M_p;
    uVar4 = this->m_lineStart;
    do {
      uVar5 = uVar4 + 1;
      uVar4 = (ulong)(byte)pcVar3[uVar4];
      if ((0x20 < uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) break;
      this->m_lineStart = uVar5;
      uVar4 = uVar5;
    } while (uVar5 != uVar2);
  }
  if (this->m_lineStart != uVar2) {
    calcLength(this);
  }
  return this;
}

Assistant:

Column::const_iterator& Column::const_iterator::operator++() {
            m_lineStart += m_lineLength;
            std::string const& current_line = m_column.m_string;
            if ( m_lineStart < current_line.size() && current_line[m_lineStart] == '\n' ) {
                m_lineStart += 1;
            } else {
                while ( m_lineStart < current_line.size() &&
                        isWhitespace( current_line[m_lineStart] ) ) {
                    ++m_lineStart;
                }
            }

            if ( m_lineStart != current_line.size() ) {
                calcLength();
            }
            return *this;
        }